

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_ResizeHysteresis_Test
          (HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c25148;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface
            (&(this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            );
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}